

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O3

const_iterator __thiscall
Quest_Context::UnserializeProgress(Quest_Context *this,const_iterator it,const_iterator end)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char cVar4;
  mapped_type *pmVar5;
  mapped_type mVar6;
  const_iterator cVar7;
  bool bVar8;
  string key;
  key_type local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  *local_40;
  char *local_38;
  
  cVar7._M_current = it._M_current;
  if ((it._M_current != end._M_current) && (*it._M_current == '{')) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    cVar7._M_current = it._M_current + 1;
    local_38 = end._M_current;
    if (cVar7._M_current != end._M_current) {
      local_40 = &this->progress;
      cVar4 = *cVar7._M_current;
      bVar1 = false;
      bVar8 = cVar4 == '}';
      if (bVar8) {
        bVar2 = false;
        mVar6 = 0;
      }
      else {
        mVar6 = 0;
        pcVar3 = it._M_current + 2;
        do {
          cVar7._M_current = pcVar3;
          if (bVar1) {
            if (cVar4 == ',') {
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                       ::operator[](local_40,&local_60);
              *pmVar5 = mVar6;
              bVar1 = false;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_60,0,(char *)local_60._M_string_length,0x1a38e9);
              bVar2 = false;
              mVar6 = 0;
            }
            else {
              mVar6 = (short)cVar4 + mVar6 * 10 + -0x30;
LAB_0018a3a7:
              bVar1 = true;
              bVar2 = true;
            }
          }
          else {
            if (cVar4 == '=') goto LAB_0018a3a7;
            bVar2 = false;
            std::__cxx11::string::push_back((char)&local_60);
            bVar1 = false;
          }
          if (cVar7._M_current == local_38) break;
          cVar4 = *cVar7._M_current;
          bVar8 = cVar4 == '}';
          pcVar3 = cVar7._M_current + 1;
        } while (!bVar8);
        it._M_current = cVar7._M_current + -1;
      }
      if (bVar2) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                 ::operator[](local_40,&local_60);
        *pmVar5 = mVar6;
      }
      if (bVar8) {
        cVar7._M_current = it._M_current + 2;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
  }
  return (const_iterator)cVar7._M_current;
}

Assistant:

std::string::const_iterator Quest_Context::UnserializeProgress(std::string::const_iterator it, std::string::const_iterator end)
{
	if (it == end || *it != '{')
		return it;

	++it;

	std::string key;
	short value = 0;
	int state = 0;

	for (; it != end && *it != '}'; ++it)
	{
		if (state == 0) // Reading key
		{
			if (*it == '=')
			{
				state = 1;
			}
			else
			{
				key += *it;
			}
		}
		else if (state == 1) // Reading value
		{
			if (*it == ',')
			{
				this->progress[key] = value;
				key = "";
				value = 0;
				state = 0;
			}
			else
			{
				value *= 10;
				value += *it - '0';
			}
		}
	}

	if (state == 1)
		this->progress[key] = value;

	if (it != end)
		++it;

	return it;
}